

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  int *piVar1;
  int iVar2;
  Rep *pRVar3;
  long lVar4;
  ulong uVar5;
  
  if (0 < num) {
    if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
      for (uVar5 = 0; (uint)num != uVar5; uVar5 = uVar5 + 1) {
        elements[uVar5] =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((this->super_RepeatedPtrFieldBase).rep_)->elements[(long)start + uVar5];
      }
    }
    pRVar3 = (this->super_RepeatedPtrFieldBase).rep_;
    if (pRVar3 != (Rep *)0x0) {
      for (lVar4 = (long)(start + num); iVar2 = pRVar3->allocated_size, lVar4 < iVar2;
          lVar4 = lVar4 + 1) {
        *(void **)((long)pRVar3 + (long)num * -8 + 8 + lVar4 * 8) = pRVar3->elements[lVar4];
        pRVar3 = (this->super_RepeatedPtrFieldBase).rep_;
      }
      piVar1 = &(this->super_RepeatedPtrFieldBase).current_size_;
      *piVar1 = *piVar1 - num;
      pRVar3->allocated_size = iVar2 - num;
    }
    return;
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      for (int i = 0; i < num; ++i) {
        elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
      }
    }
    CloseGap(start, num);
  }
}